

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O0

bool __thiscall
testing::internal::
MatcherInterfaceAdapter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::MatchAndExplain(MatcherInterfaceAdapter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *x,
                 MatchResultListener *listener)

{
  MatcherInterface<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pMVar1;
  int iVar2;
  string local_40 [32];
  MatchResultListener *local_20;
  MatchResultListener *listener_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *x_local;
  MatcherInterfaceAdapter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  pMVar1 = this->impl_;
  local_20 = listener;
  listener_local = (MatchResultListener *)x;
  x_local = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this;
  std::__cxx11::string::string(local_40,(string *)x);
  iVar2 = (*(pMVar1->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface[4])
                    (pMVar1,local_40,local_20);
  std::__cxx11::string::~string(local_40);
  return (bool)((byte)iVar2 & 1);
}

Assistant:

virtual bool MatchAndExplain(const T& x,
                               MatchResultListener* listener) const {
    return impl_->MatchAndExplain(x, listener);
  }